

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profile.hpp
# Opt level: O2

bool __thiscall
ruckig::Profile::
check_for_velocity<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
          (Profile *this,double jf,double aMax,double aMin)

{
  double dVar1;
  double dVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = (this->t)._M_elems[0];
  if (0.0 <= dVar5) {
    (this->t_sum)._M_elems[0] = dVar5;
    for (lVar3 = 1; lVar3 != 7; lVar3 = lVar3 + 1) {
      dVar1 = (this->t)._M_elems[lVar3];
      if (dVar1 < 0.0) {
        return false;
      }
      dVar5 = dVar5 + dVar1;
      (this->t_sum)._M_elems[lVar3] = dVar5;
    }
    if ((this->t_sum)._M_elems[6] <= 1000000000000.0) {
      dVar5 = (this->t)._M_elems[2];
      dVar1 = (this->t)._M_elems[4];
      dVar2 = (this->t)._M_elems[6];
      (this->j)._M_elems[0] = (double)(-(ulong)(0.0 < (this->t)._M_elems[0]) & (ulong)jf);
      (this->j)._M_elems[1] = 0.0;
      (this->j)._M_elems[2] = (double)(-(ulong)(0.0 < dVar5) & (ulong)-jf);
      (this->j)._M_elems[3] = 0.0;
      (this->j)._M_elems[4] = (double)(-(ulong)(0.0 < dVar1) & (ulong)jf);
      (this->j)._M_elems[5] = 0.0;
      (this->j)._M_elems[6] = (double)(-(ulong)(0.0 < dVar2) & (ulong)-jf);
      for (lVar3 = -0x38; lVar3 != 0; lVar3 = lVar3 + 8) {
        dVar5 = *(double *)((long)(this->t_sum)._M_elems + lVar3);
        dVar1 = *(double *)((long)(this->a)._M_elems + lVar3 + 0x38);
        dVar6 = *(double *)((long)(this->a)._M_elems + lVar3) * dVar5;
        *(double *)((long)(this->v)._M_elems + lVar3) = dVar6 + dVar1;
        dVar2 = *(double *)((long)(this->v)._M_elems + lVar3 + 0x38);
        *(double *)((long)(this->p)._M_elems + lVar3) = (dVar6 * 0.5 + dVar1) * dVar5 + dVar2;
        *(double *)((long)(this->brake).t._M_elems + lVar3 + -8) =
             ((dVar6 / 6.0 + dVar1 * 0.5) * dVar5 + dVar2) * dVar5 +
             *(double *)((long)(this->p)._M_elems + lVar3 + 0x38);
      }
      this->control_signs = UDUD;
      this->limits = NONE;
      this->direction = (uint)(aMax <= 0.0);
      dVar5 = aMax;
      if (0.0 < aMax) {
        dVar5 = aMin;
        aMin = aMax;
      }
      if ((ABS((this->v)._M_elems[7] - this->vf) < 1e-08) &&
         (ABS((this->a)._M_elems[7] - this->af) < 1e-10)) {
        dVar5 = dVar5 + -1e-12;
        dVar1 = (this->a)._M_elems[1];
        if ((dVar5 <= dVar1) && (dVar2 = (this->a)._M_elems[3], dVar5 <= dVar2)) {
          dVar4 = aMin + 1e-12;
          dVar6 = (this->a)._M_elems[5];
          return (bool)((dVar6 <= dVar4 && dVar5 <= dVar6) & -(dVar1 <= dVar4) & -(dVar2 <= dVar4));
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_for_velocity(double jf, double aMax, double aMin) {
        if (t[0] < 0) {
            return false;
        }

        t_sum[0] = t[0];
        for (size_t i = 0; i < 6; ++i) {
            if (t[i+1] < 0) {
                return false;
            }

            t_sum[i+1] = t_sum[i] + t[i+1];
        }

        if constexpr (limits == ReachedLimits::ACC0) {
            if (t[1] < std::numeric_limits<double>::epsilon()) {
                return false;
            }
        }

        if (t_sum.back() > t_max) { // For numerical reasons, is that needed?
            return false;
        }

        if constexpr (control_signs == ControlSigns::UDDU) {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? -jf : 0), 0, (t[6] > 0 ? jf : 0)};
        } else {
            j = {(t[0] > 0 ? jf : 0), 0, (t[2] > 0 ? -jf : 0), 0, (t[4] > 0 ? jf : 0), 0, (t[6] > 0 ? -jf : 0)};
        }

        for (size_t i = 0; i < 7; ++i) {
            a[i+1] = a[i] + t[i] * j[i];
            v[i+1] = v[i] + t[i] * (a[i] + t[i] * j[i] / 2);
            p[i+1] = p[i] + t[i] * (v[i] + t[i] * (a[i] / 2 + t[i] * j[i] / 6));
        }

        this->control_signs = control_signs;
        this->limits = limits;

        direction = (aMax > 0) ? Profile::Direction::UP : Profile::Direction::DOWN;
        const double aUppLim = (direction == Profile::Direction::UP ? aMax : aMin) + a_eps;
        const double aLowLim = (direction == Profile::Direction::UP ? aMin : aMax) - a_eps;

        // Velocity limit can be broken in the beginning if both initial velocity and acceleration are too high
        // std::cout << std::setprecision(15) << "target: " << std::abs(p.back() - pf) << " " << std::abs(v.back() - vf) << " " << std::abs(a.back() - af) << " T: " << t_sum.back() << " " << to_string() << std::endl;
        return std::abs(v.back() - vf) < v_precision && std::abs(a.back() - af) < a_precision
            && a[1] >= aLowLim && a[3] >= aLowLim && a[5] >= aLowLim
            && a[1] <= aUppLim && a[3] <= aUppLim && a[5] <= aUppLim;
    }